

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O1

void absl::lts_20250127::container_internal::ConvertDeletedToEmptyAndFullToDeleted
               (ctrl_t *ctrl,size_t capacity)

{
  ctrl_t *pcVar1;
  undefined8 uVar2;
  ctrl_t *pcVar3;
  
  if (ctrl[capacity] != kSentinel) {
    __assert_fail("ctrl[capacity] == ctrl_t::kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x9e,
                  "void absl::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  if ((capacity != 0) && ((capacity + 1 & capacity) == 0)) {
    pcVar1 = ctrl + capacity;
    pcVar3 = ctrl;
    if (0 < (long)capacity) {
      do {
        *pcVar3 = -(*pcVar3 < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[1] = -(pcVar3[1] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[2] = -(pcVar3[2] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[3] = -(pcVar3[3] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[4] = -(pcVar3[4] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[5] = -(pcVar3[5] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[6] = -(pcVar3[6] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[7] = -(pcVar3[7] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[8] = -(pcVar3[8] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[9] = -(pcVar3[9] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[10] = -(pcVar3[10] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[0xb] = -(pcVar3[0xb] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[0xc] = -(pcVar3[0xc] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[0xd] = -(pcVar3[0xd] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[0xe] = -(pcVar3[0xe] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3[0xf] = -(pcVar3[0xf] < ~kSentinel) & 0x7e ^ kDeleted;
        pcVar3 = pcVar3 + 0x10;
      } while (pcVar3 < pcVar1);
    }
    uVar2 = *(undefined8 *)ctrl;
    *(undefined8 *)(pcVar1 + 8) = *(undefined8 *)(ctrl + 7);
    *(undefined8 *)(pcVar1 + 1) = uVar2;
    *pcVar1 = kSentinel;
    return;
  }
  __assert_fail("IsValidCapacity(capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x9f,
                "void absl::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
               );
}

Assistant:

void ConvertDeletedToEmptyAndFullToDeleted(ctrl_t* ctrl, size_t capacity) {
  assert(ctrl[capacity] == ctrl_t::kSentinel);
  assert(IsValidCapacity(capacity));
  for (ctrl_t* pos = ctrl; pos < ctrl + capacity; pos += Group::kWidth) {
    Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
  }
  // Copy the cloned ctrl bytes.
  std::memcpy(ctrl + capacity + 1, ctrl, NumClonedBytes());
  ctrl[capacity] = ctrl_t::kSentinel;
}